

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::flush_phi_required(Compiler *this,BlockID from,BlockID to)

{
  uint32_t *puVar1;
  size_t sVar2;
  Phi *pPVar3;
  SPIRBlock *pSVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  pSVar4 = Variant::get<diligent_spirv_cross::SPIRBlock>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + to.id);
  sVar2 = (pSVar4->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.buffer_size
  ;
  bVar6 = sVar2 != 0;
  if ((bVar6) &&
     (pPVar3 = (pSVar4->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr,
     (pPVar3->parent).id != from.id)) {
    lVar5 = 0;
    do {
      bVar7 = sVar2 * 0xc + -0xc == lVar5;
      bVar6 = !bVar7;
      if (bVar7) {
        return bVar6;
      }
      puVar1 = (uint32_t *)((long)&pPVar3[1].parent.id + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (*puVar1 != from.id);
  }
  return bVar6;
}

Assistant:

bool Compiler::flush_phi_required(BlockID from, BlockID to) const
{
	auto &child = get<SPIRBlock>(to);
	for (auto &phi : child.phi_variables)
		if (phi.parent == from)
			return true;
	return false;
}